

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_add.c
# Opt level: O0

bool_t zzIsSumWEq_fast(word *b,word *a,size_t n,word w)

{
  size_t i;
  word w_local;
  size_t n_local;
  word *a_local;
  word *b_local;
  
  i = 0;
  w_local = w;
  while( true ) {
    if (n <= i) {
      return (uint)(w_local == 0);
    }
    if (b[i] != a[i] + w_local) break;
    w_local = (word)(int)(uint)(b[i] < a[i]);
    i = i + 1;
  }
  return 0;
}

Assistant:

bool_t FAST(zzIsSumWEq)(const word b[], const word a[], size_t n, 
	register word w)
{
	size_t i;
	ASSERT(wwIsValid(a, n));
	ASSERT(wwIsValid(b, n));
	for (i = 0; i < n; ++i)
	{
		if (b[i] != (word)(a[i] + w))
		{
			w = 0;
			return FALSE;
		}
		w = b[i] < a[i];
	}
	return w == 0;
}